

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

void __thiscall
DListBase<ExpirableObject_*,_RealCount>::Clear<Memory::ArenaAllocator>
          (DListBase<ExpirableObject_*,_RealCount> *this,ArenaAllocator *allocator)

{
  DListNode<ExpirableObject_*> *pDVar1;
  DListNode<ExpirableObject_*> *obj;
  
  obj = (this->super_DListNodeBase<ExpirableObject_*>).next.node;
  while (obj != (DListNode<ExpirableObject_*> *)this) {
    pDVar1 = (obj->super_DListNodeBase<ExpirableObject_*>).next.node;
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<ExpirableObject*>>
              (allocator,obj);
    obj = pDVar1;
  }
  (this->super_DListNodeBase<ExpirableObject_*>).next.list = this;
  (this->super_DListNodeBase<ExpirableObject_*>).prev.list = this;
  (this->super_RealCount).count = 0;
  return;
}

Assistant:

void Clear(TAllocator * allocator)
    {
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            AllocatorDelete(TAllocator, allocator, (Node *)current);
            current = next;
        }

        this->Next() = this;
        this->Prev() = this;
        this->SetCount(0);
    }